

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void blobGrowBuffer(Blob *pBlob,int nMin,int *pRc)

{
  char *pcVar1;
  int nAlloc;
  
  if (*pRc != 0) {
    return;
  }
  if (pBlob->nAlloc < nMin) {
    pcVar1 = (char *)sqlite3_realloc(pBlob->a,nMin);
    if (pcVar1 == (char *)0x0) {
      *pRc = 7;
    }
    else {
      pBlob->nAlloc = nMin;
      pBlob->a = pcVar1;
    }
  }
  return;
}

Assistant:

static void blobGrowBuffer(Blob *pBlob, int nMin, int *pRc){
  if( *pRc==SQLITE_OK && nMin>pBlob->nAlloc ){
    int nAlloc = nMin;
    char *a = (char *)sqlite3_realloc(pBlob->a, nAlloc);
    if( a ){
      pBlob->nAlloc = nAlloc;
      pBlob->a = a;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}